

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

ll_elem * ll_pred(ll_head *q_head,ll_elem *n)

{
  ll_elem *plVar1;
  ll_head *q_head_00;
  size_t count;
  
  plVar1 = pred(q_head,n);
  q_head_00 = (ll_head *)((ulong)plVar1 & 0xfffffffffffffffc);
  if (q_head_00 == q_head) {
    deref_release(q_head_00,(ll_elem *)0x1,count);
    q_head_00 = (ll_head *)0x0;
  }
  return &q_head_00->q;
}

Assistant:

struct ll_elem*
ll_pred(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*p;

	p = pred(q_head, n);

	/* Clean away the flag bits. */
	p = ptr_clear(p);
	if (p == &q_head->q) {
		/* Don't return q: it is not an element of the list. */
		deref_release(q_head, p, 1);
		p = NULL;
	}
	return p;
}